

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

Error __thiscall
asmjit::StringBuilder::_opVFormat(StringBuilder *this,uint32_t op,char *fmt,__va_list_tag *ap)

{
  Error EVar1;
  __gnuc_va_list in_RCX;
  char *in_RDX;
  char buf [1024];
  char local_428 [8];
  size_t in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffbe8;
  uint32_t in_stack_fffffffffffffbf4;
  StringBuilder *in_stack_fffffffffffffbf8;
  
  vsnprintf(local_428,0x400,in_RDX,in_RCX);
  EVar1 = _opString(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4,in_stack_fffffffffffffbe8,
                    in_stack_fffffffffffffbe0);
  return EVar1;
}

Assistant:

Error StringBuilder::_opVFormat(uint32_t op, const char* fmt, va_list ap) noexcept {
  char buf[1024];

  vsnprintf(buf, ASMJIT_ARRAY_SIZE(buf), fmt, ap);
  buf[ASMJIT_ARRAY_SIZE(buf) - 1] = '\0';

  return _opString(op, buf);
}